

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Liby::Buffer::append(Buffer *this,Buffer *that)

{
  char *buf;
  off_t len;
  
  if (that->leftIndex_ == that->rightIndex_) {
    return;
  }
  buf = data(that);
  len = size(that);
  append(this,buf,len);
  return;
}

Assistant:

bool Buffer::empty() const { return leftIndex_ == rightIndex_; }